

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLException::XMLException(XMLException *this,XMLException *toCopy)

{
  short *psVar1;
  XMLCh *__src;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  MemoryManager *manager;
  size_t __n;
  XMLCh *__dest;
  
  this->_vptr_XMLException = (_func_int **)&PTR__XMLException_00402248;
  this->fCode = toCopy->fCode;
  this->fSrcFile = (char *)0x0;
  this->fSrcLine = toCopy->fSrcLine;
  __src = toCopy->fMsg;
  manager = toCopy->fMemoryManager;
  if (__src == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)__src + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,__src,__n);
    manager = toCopy->fMemoryManager;
  }
  this->fMsg = __dest;
  this->fMemoryManager = manager;
  if (toCopy->fSrcFile != (char *)0x0) {
    pcVar3 = XMLString::replicate(toCopy->fSrcFile,manager);
    this->fSrcFile = pcVar3;
  }
  return;
}

Assistant:

XMLException::XMLException(const XMLException& toCopy) :
    XMemory(toCopy)
    , fCode(toCopy.fCode)
    , fSrcFile(0)
    , fSrcLine(toCopy.fSrcLine)
    , fMsg(XMLString::replicate(toCopy.fMsg, toCopy.fMemoryManager))
    , fMemoryManager(toCopy.fMemoryManager)
{
    if (toCopy.fSrcFile) {
        fSrcFile = XMLString::replicate
        (
            toCopy.fSrcFile
            , fMemoryManager
        );
    }
}